

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++:399:3)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_dynamic_test_c__:399:3)>
      *this)

{
  StringPtr name;
  Reader local_50;
  
  local_50.type = INT;
  local_50.field_1.intValue = 0x4d2;
  name.content.size_ = 10;
  name.content.ptr = "int8Field";
  capnp::DynamicStruct::Builder::set((this->func).root,name,&local_50);
  capnp::DynamicValue::Reader::~Reader(&local_50);
  return;
}

Assistant:

void run() override {
    func();
  }